

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O2

uint32_t helper_mvcl(CPUS390XState_conflict *env,uint32_t r1,uint32_t r2)

{
  int iVar1;
  ulong uVar2;
  _Bool _Var3;
  int mmu_idx;
  uint uVar4;
  uint uVar5;
  uint64_t dest;
  ulong uVar6;
  uint32_t uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uintptr_t unaff_retaddr;
  ulong local_c8;
  S390Access local_80;
  S390Access local_58;
  
  mmu_idx = cpu_mmu_index(env,SUB41(r1,0));
  uVar4 = r1 + 1;
  uVar9 = env->regs[uVar4] & 0xffffff;
  dest = get_address(env,r1);
  uVar5 = r2 + 1;
  uVar2 = env->regs[uVar5];
  uVar10 = uVar2 & 0xffffff;
  local_c8 = get_address(env,r2);
  uVar8 = uVar9;
  if (uVar10 < uVar9) {
    uVar8 = uVar10;
  }
  _Var3 = is_destructive_overlap(env,dest,local_c8,(uint32_t)uVar8);
  if (_Var3) {
    uVar7 = 3;
  }
  else {
    uVar7 = 0;
    if (uVar10 != uVar9) {
      uVar7 = 2 - (uVar9 < uVar10);
    }
    if (uVar9 != 0) {
      if (uVar10 == 0) {
        set_address_zero(env,r2,local_c8);
      }
      do {
        if (uVar9 == 0) {
          return uVar7;
        }
        uVar8 = -(dest | 0xfffffffffffff000);
        if (uVar9 < -(dest | 0xfffffffffffff000)) {
          uVar8 = uVar9;
        }
        if (uVar10 == 0) {
          access_prepare(&local_80,env,dest,(int)uVar8,MMU_DATA_STORE,mmu_idx,unaff_retaddr);
          access_memset(env,&local_80,(uint8_t)(uVar2 >> 0x18),unaff_retaddr);
          uVar10 = 0;
        }
        else {
          uVar6 = -(local_c8 | 0xfffffffffffff000);
          if (uVar10 < -(local_c8 | 0xfffffffffffff000)) {
            uVar6 = uVar10;
          }
          if (uVar6 < uVar8) {
            uVar8 = uVar6;
          }
          access_prepare(&local_58,env,local_c8,(int)uVar8,MMU_DATA_LOAD,mmu_idx,unaff_retaddr);
          access_prepare(&local_80,env,dest,(int)uVar8,MMU_DATA_STORE,mmu_idx,unaff_retaddr);
          access_memmove(env,&local_80,&local_58,unaff_retaddr);
          local_c8 = wrap_address(env,local_c8 + uVar8);
          uVar10 = uVar10 - uVar8;
          env->regs[uVar5] =
               (ulong)((uint)uVar10 & 0xffffff) | env->regs[uVar5] & 0xffffffffff000000;
          set_address_zero(env,r2,local_c8);
        }
        dest = wrap_address(env,dest + uVar8);
        uVar9 = uVar9 - uVar8;
        env->regs[uVar4] = (ulong)((uint)uVar9 & 0xffffff) | env->regs[uVar4] & 0xffffffffff000000;
        set_address_zero(env,r1,dest);
      } while ((uVar9 == 0) ||
              (iVar1._0_1_ = env[-1].cpu_state, iVar1._1_1_ = env[-1].sigp_order,
              iVar1._2_2_ = *(undefined2 *)&env[-1].field_0x4b2, -1 < iVar1));
      cpu_loop_exit_restore_s390x((CPUState *)(env[-0x1e].vregs + 0xf),unaff_retaddr);
    }
  }
  set_address_zero(env,r2,local_c8);
  set_address_zero(env,r1,dest);
  return uVar7;
}

Assistant:

uint32_t HELPER(mvcl)(CPUS390XState *env, uint32_t r1, uint32_t r2)
{
    const int mmu_idx = cpu_mmu_index(env, false);
    uintptr_t ra = GETPC();
    uint64_t destlen = env->regs[r1 + 1] & 0xffffff;
    uint64_t dest = get_address(env, r1);
    uint64_t srclen = env->regs[r2 + 1] & 0xffffff;
    uint64_t src = get_address(env, r2);
    uint8_t pad = env->regs[r2 + 1] >> 24;
    CPUState *cs = env_cpu(env);
    S390Access srca, desta;
    uint32_t cc, cur_len;

    if (is_destructive_overlap(env, dest, src, MIN(srclen, destlen))) {
        cc = 3;
    } else if (srclen == destlen) {
        cc = 0;
    } else if (destlen < srclen) {
        cc = 1;
    } else {
        cc = 2;
    }

    /* We might have to zero-out some bits even if there was no action. */
    if (unlikely(!destlen || cc == 3)) {
        set_address_zero(env, r2, src);
        set_address_zero(env, r1, dest);
        return cc;
    } else if (!srclen) {
        set_address_zero(env, r2, src);
    }

    /*
     * Only perform one type of type of operation (move/pad) in one step.
     * Stay within single pages.
     */
    while (destlen) {
        cur_len = MIN(destlen, -(dest | TARGET_PAGE_MASK));
        if (!srclen) {
            desta = access_prepare(env, dest, cur_len, MMU_DATA_STORE, mmu_idx,
                                   ra);
            access_memset(env, &desta, pad, ra);
        } else {
            cur_len = MIN(MIN(srclen, -(src | TARGET_PAGE_MASK)), cur_len);

            srca = access_prepare(env, src, cur_len, MMU_DATA_LOAD, mmu_idx,
                                  ra);
            desta = access_prepare(env, dest, cur_len, MMU_DATA_STORE, mmu_idx,
                                   ra);
            access_memmove(env, &desta, &srca, ra);
            src = wrap_address(env, src + cur_len);
            srclen -= cur_len;
            env->regs[r2 + 1] = deposit64(env->regs[r2 + 1], 0, 24, srclen);
            set_address_zero(env, r2, src);
        }
        dest = wrap_address(env, dest + cur_len);
        destlen -= cur_len;
        env->regs[r1 + 1] = deposit64(env->regs[r1 + 1], 0, 24, destlen);
        set_address_zero(env, r1, dest);

        /*
         * MVCL is interruptible. Return to the main loop if requested after
         * writing back all state to registers. If no interrupt will get
         * injected, we'll end up back in this handler and continue processing
         * the remaining parts.
         */
        if (destlen && unlikely(cpu_loop_exit_requested(cs))) {
            cpu_loop_exit_restore(cs, ra);
        }
    }
    return cc;
}